

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3rbu_step(sqlite3rbu *p)

{
  RbuObjIter *pIter;
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uchar uVar4;
  sqlite3_file *psVar5;
  sqlite3_file *psVar6;
  RbuUpdateStmt *pRVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uchar *zSql;
  sqlite3_value *psVar11;
  RbuUpdateStmt *pRVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  uint uVar16;
  RbuUpdateStmt **ppRVar17;
  char *pcVar18;
  char *zFmt;
  char *pcVar19;
  RbuFrame *pRVar20;
  sqlite3_stmt *psVar21;
  long lVar22;
  u32 uVar23;
  sqlite3_stmt *pStmt;
  RbuUpdateStmt **ppRVar24;
  char **ppcVar25;
  bool bVar26;
  uchar *local_58;
  sqlite3_stmt *pSql;
  char **local_48;
  RbuUpdateStmt **local_40;
  sqlite3_stmt *local_38;
  
  if (p == (sqlite3rbu *)0x0) {
    return 7;
  }
  iVar8 = p->eStage;
  if (iVar8 == 4) {
    if (p->rc != 0) goto LAB_00129e25;
    iVar8 = p->nStep;
    if (iVar8 < p->nFrame) {
      pRVar20 = p->aFrame;
      uVar23 = pRVar20[iVar8].iDbPage;
      uVar10 = p->nPagePerSector;
      do {
        psVar6 = p->pTargetFd->pReal;
        psVar5 = p->pTargetFd->pWalFd->pReal;
        iVar9 = (*psVar5->pMethods->xRead)
                          (psVar5,p->aBuf,p->pgsz,
                           ((long)p->pgsz + 0x18) * (ulong)(pRVar20[iVar8].iWalFrame - 1) + 0x38);
        p->rc = iVar9;
        bVar26 = true;
        if (iVar9 == 0) {
          iVar8 = (*psVar6->pMethods->xWrite)
                            (psVar6,p->aBuf,p->pgsz,
                             (ulong)(pRVar20[iVar8].iDbPage - 1) * (long)p->pgsz);
          p->rc = iVar8;
          bVar26 = iVar8 != 0;
        }
        iVar9 = p->nStep;
        iVar8 = iVar9 + 1;
        p->nStep = iVar8;
        if (p->nFrame <= iVar8) break;
        uVar16 = (uVar23 - 1) / uVar10;
        pRVar20 = p->aFrame;
        uVar23 = pRVar20[(long)iVar9 + 1].iDbPage;
        uVar10 = p->nPagePerSector;
      } while (!(bool)(uVar16 != (uVar23 - 1) / uVar10 | bVar26));
    }
    else {
      psVar6 = p->pTargetFd->pReal;
      iVar8 = (*psVar6->pMethods->xSync)(psVar6,2);
      p->rc = iVar8;
      if (iVar8 == 0) {
        iVar8 = (*psVar6->pMethods->xShmMap)(psVar6,0,0x8000,0,&pSql);
        p->rc = iVar8;
        if ((iVar8 == 0) && (*(u32 *)(pSql + 0x60) = p->iMaxFrame, p->rc == 0)) {
          p->eStage = 5;
          p->rc = 0x65;
        }
      }
    }
  }
  else {
    if (iVar8 != 2) {
      if (iVar8 == 1) {
        if (((p->zTarget == (char *)0x0) && (p->nProgress == 0)) && (p->rc == 0)) {
          pSql = (sqlite3_stmt *)0x0;
          local_38 = (sqlite3_stmt *)0x0;
          ppcVar25 = &p->zErrmsg;
          iVar8 = sqlite3_exec(p->dbMain,"PRAGMA writable_schema=1",(sqlite3_callback)0x0,
                               (void *)0x0,ppcVar25);
          p->rc = iVar8;
          psVar21 = (sqlite3_stmt *)0x0;
          if (iVar8 == 0) {
            iVar8 = prepareAndCollectError
                              (p->dbRbu,&pSql,ppcVar25,
                               "SELECT sql FROM sqlite_master WHERE sql!=\'\' AND rootpage!=0 AND name!=\'sqlite_sequence\'  ORDER BY type DESC"
                              );
            p->rc = iVar8;
            psVar21 = pSql;
          }
          while ((iVar8 == 0 && (iVar8 = sqlite3_step(psVar21), iVar8 == 100))) {
            zSql = sqlite3_column_text(psVar21,0);
            iVar8 = sqlite3_exec(p->dbMain,(char *)zSql,(sqlite3_callback)0x0,(void *)0x0,ppcVar25);
            p->rc = iVar8;
          }
          rbuFinalize(p,psVar21);
          if (p->rc == 0) {
            iVar8 = prepareAndCollectError
                              (p->dbRbu,&pSql,ppcVar25,
                               "SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL");
            p->rc = iVar8;
            if (iVar8 == 0) {
              iVar8 = prepareAndCollectError
                                (p->dbMain,&local_38,ppcVar25,
                                 "INSERT INTO sqlite_master VALUES(?,?,?,?,?)");
              p->rc = iVar8;
              psVar21 = pSql;
              pStmt = local_38;
            }
            else {
              psVar21 = pSql;
              pStmt = (sqlite3_stmt *)0x0;
            }
            while (iVar8 == 0) {
              iVar8 = sqlite3_step(psVar21);
              if (iVar8 != 100) {
                if (p->rc == 0) {
                  iVar8 = sqlite3_exec(p->dbMain,"PRAGMA writable_schema=0",(sqlite3_callback)0x0,
                                       (void *)0x0,ppcVar25);
                  p->rc = iVar8;
                }
                break;
              }
              iVar8 = 0;
              while (iVar8 != 5) {
                psVar11 = sqlite3_column_value(psVar21,iVar8);
                sqlite3_bind_value(pStmt,iVar8 + 1,psVar11);
                iVar8 = iVar8 + 1;
              }
              sqlite3_step(pStmt);
              iVar8 = sqlite3_reset(pStmt);
              p->rc = iVar8;
            }
            rbuFinalize(p,psVar21);
            rbuFinalize(p,pStmt);
          }
          rbuCopyPragma(p,"user_version");
          rbuCopyPragma(p,"application_id");
        }
        pIter = &p->objiter;
        piVar1 = &p->rc;
        local_40 = &(p->objiter).pRbuUpdate;
        ppcVar25 = &p->zErrmsg;
        while (*piVar1 == 0) {
          if ((p->objiter).zTbl == (char *)0x0) {
            rbuSaveState(p,2);
            if (p->rc == 0) {
              iVar8 = prepareAndCollectError
                                (*(sqlite3 **)
                                  (p->zStateDb + (ulong)(p->zTarget == (char *)0x0) * 8 + -0x28),
                                 &pSql,ppcVar25,"PRAGMA schema_version");
              psVar21 = pSql;
              p->rc = iVar8;
              if (iVar8 == 0) {
                iVar8 = sqlite3_step(pSql);
                if (iVar8 == 100) {
                  sqlite3_column_int(psVar21,0);
                }
                rbuFinalize(p,psVar21);
                if ((p->rc == 0) &&
                   (rbuMPrintfExec(p,p->dbMain,"PRAGMA schema_version = %d"), p->rc == 0)) {
                  iVar8 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,ppcVar25
                                      );
                  p->rc = iVar8;
                  if (iVar8 == 0) {
                    iVar8 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,
                                         ppcVar25);
                    p->rc = iVar8;
                  }
                }
              }
            }
            p->eStage = 2;
            break;
          }
          if ((p->objiter).bCleanup == 0) {
            rbuObjIterPrepareAll(p,pIter,0);
            if (p->rc == 0) {
              iVar8 = sqlite3_step((p->objiter).pSelect);
              if (iVar8 == 100) {
                uVar2 = p->nStep;
                uVar3 = p->nProgress;
                p->nStep = uVar2 + 1;
                p->nProgress = uVar3 + 1;
                iVar8 = (p->objiter).nCol;
                local_48 = ppcVar25;
                uVar10 = sqlite3_column_type((p->objiter).pSelect,iVar8);
                if ((char)uVar10 == '\x03') {
                  local_58 = sqlite3_column_text((p->objiter).pSelect,iVar8);
                  uVar10 = 6;
                  if (local_58 == (uchar *)0x0) {
                    *piVar1 = 7;
                    goto LAB_00129eaa;
                  }
LAB_00129eb3:
                  pcVar13 = (p->objiter).zIdx;
                  if ((pcVar13 != (char *)0x0) || ((uVar10 & 6) != 4)) {
                    if (uVar10 == 6) {
                      p->nPhaseOneStep = p->nPhaseOneStep - (long)(p->objiter).nIndex;
                      uVar10 = 0;
                      pRVar12 = (RbuUpdateStmt *)0x0;
                      ppRVar24 = local_40;
                      goto LAB_00129f27;
                    }
                    if (uVar10 == 3) {
                      if (pcVar13 == (char *)0x0) {
                        p->nPhaseOneStep = p->nPhaseOneStep + (long)(p->objiter).nIndex;
                        rbuStepOneOp(p,2);
                      }
                      if (*piVar1 != 0) break;
                      uVar10 = 1;
                    }
                    rbuStepOneOp(p,uVar10);
                    break;
                  }
                }
                else if (((uVar10 & 0xff) == 1) &&
                        (uVar10 = sqlite3_column_int((p->objiter).pSelect,iVar8), uVar10 < 5)) {
                  uVar10 = uVar10 + 1;
LAB_00129eaa:
                  local_58 = (uchar *)0x0;
                  goto LAB_00129eb3;
                }
                rbuBadControlError(p);
                break;
              }
              iVar8 = sqlite3_reset((p->objiter).pSelect);
              p->rc = iVar8;
              p->nStep = 0;
            }
          }
          else if ((p->zTarget != (char *)0x0) && ((p->objiter).abIndexed != (u8 *)0x0)) {
            rbuMPrintfExec(p,p->dbRbu,"DELETE FROM %s.\'rbu_tmp_%q\'",p->zStateDb,
                           (p->objiter).zDataTbl);
          }
          rbuObjIterNext(p,pIter);
        }
      }
      goto LAB_00129e25;
    }
    if (p->rc != 0) goto LAB_00129e25;
    pcVar13 = sqlite3_db_filename(p->dbMain,"main");
    if (p->zTarget == (char *)0x0) {
      pcVar13 = sqlite3_db_filename(p->dbRbu,"main");
    }
    pcVar15 = sqlite3_mprintf("%s-oal",pcVar13);
    pcVar13 = sqlite3_mprintf("%s-wal",pcVar13);
    if (pcVar15 == (char *)0x0 || pcVar13 == (char *)0x0) {
      p->rc = 7;
    }
    else {
      psVar6 = p->pTargetFd->pReal;
      iVar8 = (*psVar6->pMethods->xLock)(psVar6,1);
      p->rc = iVar8;
      if (iVar8 == 0) {
        iVar8 = (*psVar6->pMethods->xLock)(psVar6,4);
        p->rc = iVar8;
        if (iVar8 == 0) {
          rbuObjIterFinalize(&p->objiter);
          sqlite3_close(p->dbRbu);
          sqlite3_close(p->dbMain);
          p->dbMain = (sqlite3 *)0x0;
          p->dbRbu = (sqlite3 *)0x0;
          iVar9 = rename(pcVar15,pcVar13);
          iVar8 = 10;
          if (iVar9 == 0) {
            iVar8 = 0;
          }
          p->rc = iVar8;
          if (iVar9 == 0) {
            rbuOpenDatabase(p,(int *)0x0);
            rbuSetupCheckpoint(p,(RbuState *)0x0);
          }
        }
      }
    }
    sqlite3_free(pcVar13);
    sqlite3_free(pcVar15);
  }
  p->nProgress = p->nProgress + 1;
  goto LAB_00129e25;
LAB_00129f27:
  pRVar7 = *ppRVar24;
  if (pRVar7 == (RbuUpdateStmt *)0x0) goto LAB_00129f5c;
  iVar8 = strcmp(pRVar7->zMask,(char *)local_58);
  if (iVar8 == 0) {
    *ppRVar24 = pRVar7->pNext;
    pRVar7->pNext = *local_40;
    *local_40 = pRVar7;
    psVar21 = pRVar7->pUpdate;
    ppcVar25 = local_48;
    goto LAB_0012a15e;
  }
  uVar10 = uVar10 + 1;
  ppRVar24 = &pRVar7->pNext;
  pRVar12 = pRVar7;
  goto LAB_00129f27;
LAB_00129f5c:
  ppRVar24 = local_40;
  if (uVar10 < 0x10) {
    pRVar12 = (RbuUpdateStmt *)rbuMalloc(p,(long)(p->objiter).nTblCol + 0x19);
    if (pRVar12 == (RbuUpdateStmt *)0x0) goto LAB_00129e25;
  }
  else {
    do {
      ppRVar17 = ppRVar24;
      pRVar7 = *ppRVar17;
      ppRVar24 = &pRVar7->pNext;
    } while (pRVar7 != pRVar12);
    *ppRVar17 = (RbuUpdateStmt *)0x0;
    sqlite3_finalize(pRVar12->pUpdate);
    pRVar12->pUpdate = (sqlite3_stmt *)0x0;
  }
  pcVar13 = rbuObjIterGetWhere(p,pIter);
  iVar8 = (p->objiter).nTblCol;
  if (p->rc == 0) {
    sVar14 = strlen((char *)local_58);
    if (iVar8 != (int)sVar14) {
      rbuBadControlError(p);
      iVar8 = (p->objiter).nTblCol;
      goto LAB_0012a0bf;
    }
    pcVar18 = "";
    pcVar15 = (char *)0x0;
    for (lVar22 = 0; lVar22 < iVar8; lVar22 = lVar22 + 1) {
      uVar4 = local_58[(p->objiter).aiSrcOrder[lVar22]];
      if (uVar4 == 'd') {
        pcVar19 = (p->objiter).azTblCol[lVar22];
        zFmt = "%z%s\"%w\"=rbu_delta(\"%w\", ?%d)";
LAB_0012a093:
        pcVar15 = rbuMPrintf(p,zFmt,pcVar15,pcVar18,pcVar19,pcVar19,(int)lVar22 + 1);
LAB_0012a0a0:
        pcVar18 = ", ";
      }
      else {
        if (uVar4 == 'f') {
          pcVar19 = (p->objiter).azTblCol[lVar22];
          zFmt = "%z%s\"%w\"=rbu_fossil_delta(\"%w\", ?%d)";
          goto LAB_0012a093;
        }
        if (uVar4 == 'x') {
          pcVar15 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcVar15,pcVar18,(p->objiter).azTblCol[lVar22],
                               lVar22 + 1U & 0xffffffff);
          goto LAB_0012a0a0;
        }
      }
      iVar8 = (p->objiter).nTblCol;
    }
  }
  else {
LAB_0012a0bf:
    pcVar15 = (char *)0x0;
  }
  pRVar12->zMask = (char *)(pRVar12 + 1);
  memcpy(pRVar12 + 1,local_58,(long)iVar8);
  pRVar12->pNext = *local_40;
  *local_40 = pRVar12;
  if (pcVar15 == (char *)0x0) {
    psVar21 = (sqlite3_stmt *)0x0;
    ppcVar25 = local_48;
  }
  else {
    pcVar18 = "rbu_imp_";
    if ((p->objiter).eType == 5) {
      pcVar18 = "";
    }
    pcVar18 = sqlite3_mprintf("UPDATE \"%s%w\" SET %s WHERE %s",pcVar18,(p->objiter).zTbl,pcVar15,
                              pcVar13);
    ppcVar25 = local_48;
    iVar8 = prepareFreeAndCollectError(p->dbMain,&pRVar12->pUpdate,local_48,pcVar18);
    p->rc = iVar8;
    psVar21 = pRVar12->pUpdate;
  }
  sqlite3_free(pcVar13);
  sqlite3_free(pcVar15);
LAB_0012a15e:
  if (psVar21 != (sqlite3_stmt *)0x0) {
    lVar22 = 0;
    while (*piVar1 == 0) {
      iVar8 = (p->objiter).nCol;
      if (iVar8 <= lVar22) {
        if (((p->objiter).eType | 4U) == 5) {
          psVar11 = sqlite3_column_value((p->objiter).pSelect,iVar8 + 1);
          iVar8 = sqlite3_bind_value(psVar21,(p->objiter).nCol + 1,psVar11);
          p->rc = iVar8;
          if (iVar8 != 0) break;
        }
        sqlite3_step(psVar21);
        iVar8 = resetAndCollectError(psVar21,ppcVar25);
        *piVar1 = iVar8;
        break;
      }
      uVar4 = local_58[(p->objiter).aiSrcOrder[lVar22]];
      psVar11 = sqlite3_column_value((p->objiter).pSelect,(int)lVar22);
      if (((p->objiter).abTblPk[lVar22] != '\0') || (uVar4 != '.')) {
        iVar8 = sqlite3_bind_value(psVar21,(int)lVar22 + 1,psVar11);
        *piVar1 = iVar8;
      }
      lVar22 = lVar22 + 1;
      ppcVar25 = local_48;
    }
  }
LAB_00129e25:
  return p->rc;
}

Assistant:

SQLITE_API int sqlite3rbu_step(sqlite3rbu *p){
  if( p ){
    switch( p->eStage ){
      case RBU_STAGE_OAL: {
        RbuObjIter *pIter = &p->objiter;

        /* If this is an RBU vacuum operation and the state table was empty
        ** when this handle was opened, create the target database schema. */
        if( rbuIsVacuum(p) && p->nProgress==0 && p->rc==SQLITE_OK ){
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p, "user_version");
          rbuCopyPragma(p, "application_id");
        }

        while( p->rc==SQLITE_OK && pIter->zTbl ){

          if( pIter->bCleanup ){
            /* Clean up the rbu_tmp_xxx table for the previous table. It 
            ** cannot be dropped as there are currently active SQL statements.
            ** But the contents can be deleted.  */
            if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
              rbuMPrintfExec(p, p->dbRbu, 
                  "DELETE FROM %s.'rbu_tmp_%q'", p->zStateDb, pIter->zDataTbl
              );
            }
          }else{
            rbuObjIterPrepareAll(p, pIter, 0);

            /* Advance to the next row to process. */
            if( p->rc==SQLITE_OK ){
              int rc = sqlite3_step(pIter->pSelect);
              if( rc==SQLITE_ROW ){
                p->nProgress++;
                p->nStep++;
                return rbuStep(p);
              }
              p->rc = sqlite3_reset(pIter->pSelect);
              p->nStep = 0;
            }
          }

          rbuObjIterNext(p, pIter);
        }

        if( p->rc==SQLITE_OK ){
          assert( pIter->zTbl==0 );
          rbuSaveState(p, RBU_STAGE_MOVE);
          rbuIncrSchemaCookie(p);
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
          }
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
          }
          p->eStage = RBU_STAGE_MOVE;
        }
        break;
      }

      case RBU_STAGE_MOVE: {
        if( p->rc==SQLITE_OK ){
          rbuMoveOalFile(p);
          p->nProgress++;
        }
        break;
      }

      case RBU_STAGE_CKPT: {
        if( p->rc==SQLITE_OK ){
          if( p->nStep>=p->nFrame ){
            sqlite3_file *pDb = p->pTargetFd->pReal;
  
            /* Sync the db file */
            p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  
            /* Update nBackfill */
            if( p->rc==SQLITE_OK ){
              void volatile *ptr;
              p->rc = pDb->pMethods->xShmMap(pDb, 0, 32*1024, 0, &ptr);
              if( p->rc==SQLITE_OK ){
                ((u32 volatile*)ptr)[24] = p->iMaxFrame;
              }
            }
  
            if( p->rc==SQLITE_OK ){
              p->eStage = RBU_STAGE_DONE;
              p->rc = SQLITE_DONE;
            }
          }else{
            /* At one point the following block copied a single frame from the
            ** wal file to the database file. So that one call to sqlite3rbu_step()
            ** checkpointed a single frame. 
            **
            ** However, if the sector-size is larger than the page-size, and the
            ** application calls sqlite3rbu_savestate() or close() immediately
            ** after this step, then rbu_step() again, then a power failure occurs,
            ** then the database page written here may be damaged. Work around
            ** this by checkpointing frames until the next page in the aFrame[]
            ** lies on a different disk sector to the current one. */
            u32 iSector;
            do{
              RbuFrame *pFrame = &p->aFrame[p->nStep];
              iSector = (pFrame->iDbPage-1) / p->nPagePerSector;
              rbuCheckpointFrame(p, pFrame);
              p->nStep++;
            }while( p->nStep<p->nFrame 
                 && iSector==((p->aFrame[p->nStep].iDbPage-1) / p->nPagePerSector)
                 && p->rc==SQLITE_OK
            );
          }
          p->nProgress++;
        }
        break;
      }

      default:
        break;
    }
    return p->rc;
  }else{
    return SQLITE_NOMEM;
  }
}